

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O1

void do_questtxt(char *infile,char *outfile)

{
  bool bVar1;
  bool bVar2;
  FILE *pFVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  byte *pbVar10;
  char *extraout_RAX;
  char *pcVar11;
  uint uVar12;
  byte *pbVar13;
  long *plVar14;
  char *__filename;
  msghdr *pmVar15;
  char *pcVar16;
  int *unaff_RBP;
  byte bVar17;
  char *pcVar18;
  long lVar19;
  byte bVar20;
  char *__filename_00;
  long lVar21;
  long lVar22;
  long lVar23;
  char *unaff_R12;
  uint uVar24;
  char *unaff_R13;
  msghdr *unaff_R15;
  char (*__s2) [3];
  char code [256];
  char acStack_3b8 [256];
  long alStack_2b8 [33];
  char *pcStack_1b0;
  char *pcStack_1a8;
  char *pcStack_1a0;
  char *pcStack_198;
  msghdr *pmStack_190;
  code *pcStack_188;
  char *pcStack_180;
  msghdr *pmStack_178;
  char *pcStack_170;
  char *pcStack_168;
  char *pcStack_160;
  msghdr *pmStack_158;
  code *pcStack_150;
  int local_13c;
  char local_138 [264];
  
  pcVar18 = "r";
  pcStack_150 = (code *)0x10a885;
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ae55:
    pcStack_150 = (code *)0x10ae5d;
    do_questtxt_cold_7();
  }
  else {
    pcVar18 = "w+";
    pcStack_150 = (code *)0x10a8a4;
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_150 = (code *)0x10a8e1;
      pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
      pmVar15 = (msghdr *)outfile;
      if (pcVar18 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = local_138;
        unaff_RBP = &local_13c;
        unaff_R15 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          infile = (char *)(ulong)(uint)qt_line;
          if ((in_line._0_4_ & 0xff) != 0x23) {
            if (((in_line._0_4_ & 0xff) == 0x25) &&
               ((uVar12 = (uint)in_line._0_4_ >> 8 & 0xff, uVar12 == 0x45 || (uVar12 == 0x43)))) {
              local_13c = 0;
              uVar12 = (uint)in_line._0_4_ >> 8 & 0xff;
              if (uVar12 == 0x45) {
                if (in_msg != '\0') {
                  in_msg = '\0';
                  goto LAB_0010aadd;
                }
                pcVar18 = "End record encountered before message - line %d\n";
              }
              else if (uVar12 == 0x43) {
                if (in_msg == '\0') {
                  in_msg = '\x01';
                  pcStack_150 = (code *)0x10a994;
                  iVar4 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                  if (iVar4 == 2) {
                    pcStack_150 = (code *)0x10a9a5;
                    iVar5 = get_hdr(unaff_R13);
                    iVar4 = qt_hdr.n_hdr;
                    if (iVar5 == 0) {
                      infile = (char *)(long)qt_hdr.n_hdr;
                      if ((long)infile < 0x10) {
                        pcStack_150 = (code *)0x10a9da;
                        strncpy(qt_hdr.id[(long)infile],unaff_R13,3);
                        lVar7 = (long)qt_hdr.n_hdr;
                        msg_hdr[lVar7].n_msg = 0;
                        qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                        qt_hdr.offset[lVar7] = 0;
                      }
                      else {
                        pcStack_150 = (code *)0x10ab85;
                        do_questtxt_cold_2();
                      }
                      if (0xf < iVar4) goto LAB_0010aadd;
                    }
                    pcStack_150 = (code *)0x10aa1b;
                    iVar4 = get_hdr(unaff_R13);
                    lVar7 = (long)(iVar4 + -1);
                    lVar8 = lVar7 * 0x2ee8 + 0x1203f8;
                    iVar4 = msg_hdr[lVar7].n_msg;
                    lVar19 = (long)iVar4;
                    if (0 < lVar19) {
                      lVar21 = 0;
                      do {
                        if (*(int *)(lVar8 + lVar21) == local_13c) {
                          pcStack_150 = (code *)0x10ab7b;
                          do_questtxt_cold_4();
                          goto LAB_0010aadd;
                        }
                        lVar21 = lVar21 + 0x18;
                      } while (lVar19 * 0x18 != lVar21);
                    }
                    if (iVar4 < 500) {
                      msg_hdr[lVar7].n_msg = iVar4 + 1;
                      curr_msg = (qtmsg *)(lVar8 + lVar19 * 0x18);
                      curr_msg->msgnum = local_13c;
                      curr_msg->delivery = in_line[2];
                      curr_msg->offset = 0;
                      curr_msg->size = 0;
                    }
                    else {
                      pcStack_150 = (code *)0x10ab71;
                      do_questtxt_cold_3();
                    }
                  }
                  else {
                    pcStack_150 = (code *)0x10ab67;
                    do_questtxt_cold_1();
                  }
                  goto LAB_0010aadd;
                }
                pcVar18 = "Control record encountered during message - line %d\n";
              }
              else {
                pcVar18 = "Unrecognized Control record at line %d\n";
              }
              pcStack_150 = (code *)0x10ab5d;
              fprintf(_stderr,pcVar18,(ulong)(uint)qt_line);
            }
            else {
              if (in_msg == '\0') {
                pcStack_150 = (code *)0x10aaa9;
                sVar9 = strlen(in_line);
                if (sVar9 == 1) goto LAB_0010aadd;
              }
              if (in_msg == '\0') {
                pcStack_150 = (code *)0x10ab1a;
                fprintf(_stderr,"Text encountered outside message - line %d\n",infile);
              }
              pcStack_150 = (code *)0x10aac0;
              sVar9 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar9;
            }
          }
LAB_0010aadd:
          pcStack_150 = (code *)0x10aaf1;
          pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
          pmVar15 = (msghdr *)in_line;
        } while (pcVar18 != (char *)0x0);
      }
      pcStack_150 = (code *)0x10ab9a;
      fseek((FILE *)ifp,0,0);
      iVar4 = qt_hdr.n_hdr;
      in_msg = '\0';
      lVar7 = (long)qt_hdr.n_hdr;
      lVar8 = lVar7 * 0xb + 4;
      if (0 < lVar7) {
        plVar14 = qt_hdr.offset;
        lVar19 = 0;
        do {
          *plVar14 = lVar8;
          lVar8 = lVar8 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar19 + -8) * 0x18 + 4;
          lVar19 = lVar19 + 0x2ee8;
          plVar14 = plVar14 + 1;
        } while (lVar7 * 0x2ee8 - lVar19 != 0);
      }
      if (0 < iVar4) {
        lVar19 = 0x120408;
        lVar21 = 0;
        lVar22 = 0;
        do {
          iVar4 = msg_hdr[lVar21].n_msg;
          if (0 < (long)iVar4) {
            lVar23 = 0;
            do {
              *(long *)(lVar19 + -8 + lVar23) = lVar22 + lVar8;
              lVar22 = lVar22 + *(long *)(lVar19 + lVar23);
              lVar23 = lVar23 + 0x18;
            } while ((long)iVar4 * 0x18 != lVar23);
          }
          lVar21 = lVar21 + 1;
          lVar19 = lVar19 + 0x2ee8;
        } while (lVar21 != lVar7);
      }
      pcVar18 = (char *)0x4;
      pcStack_150 = (code *)0x10ac67;
      sVar9 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar9 == 1) {
        pcVar18 = (char *)0x3;
        pcStack_150 = (code *)0x10ac8f;
        sVar9 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar9) {
          pcVar18 = (char *)0x8;
          pcStack_150 = (code *)0x10acb6;
          sVar9 = fwrite(qt_hdr.offset,8,(long)qt_hdr.n_hdr,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar9) {
            if (0 < qt_hdr.n_hdr) {
              pmVar15 = msg_hdr;
              infile = (char *)0x0;
              do {
                pcVar18 = (char *)0x4;
                pcStack_150 = (code *)0x10aceb;
                sVar9 = fwrite(pmVar15,4,1,(FILE *)ofp);
                if ((int)sVar9 != 1) goto LAB_0010ae50;
                pcVar18 = (char *)0x18;
                pcStack_150 = (code *)0x10ad0c;
                sVar9 = fwrite(pmVar15->qt_msg,0x18,(long)pmVar15->n_msg,(FILE *)ofp);
                if (pmVar15->n_msg != (int)sVar9) goto LAB_0010ae50;
                infile = infile + 1;
                pmVar15 = pmVar15 + 1;
              } while ((long)infile < (long)qt_hdr.n_hdr);
            }
            pcStack_150 = (code *)0x10ad42;
            pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
            uVar12 = in_line._0_4_;
            do {
              in_line._0_4_ = uVar12;
              if (pcVar18 == (char *)0x0) {
                pcStack_150 = (code *)0x10ae32;
                fclose((FILE *)ifp);
                pcStack_150 = (code *)0x10ae3e;
                fclose((FILE *)ofp);
                return;
              }
              uVar24 = uVar12 & 0xff;
              if (uVar24 != 0x23) {
                if (uVar24 == 0x25) {
                  uVar6 = uVar12 >> 8 & 0xff;
                  if ((uVar6 == 0x45) || (uVar6 == 0x43)) {
                    in_line[1] = (char)(uVar12 >> 8);
                    in_msg = in_line[1] == 'C';
                  }
                  else if ((char)uVar12 != '#') goto LAB_0010ada7;
                }
                else {
LAB_0010ada7:
                  if (in_msg == '\0') {
                    pcStack_150 = (code *)0x10adb8;
                    sVar9 = strlen(in_line);
                    if (sVar9 == 1) goto LAB_0010ae09;
                  }
                  pbVar10 = &xcrypt_buf;
                  if ((char)uVar12 != '\0') {
                    iVar4 = 1;
                    pcVar18 = in_line;
                    pbVar10 = &xcrypt_buf;
                    do {
                      pcVar18 = (char *)((byte *)pcVar18 + 1);
                      bVar17 = (byte)iVar4;
                      if ((uVar24 & 0x60) == 0) {
                        bVar17 = 0;
                      }
                      *pbVar10 = bVar17 ^ (byte)uVar24;
                      iVar4 = iVar4 * 2;
                      if (0x1f < iVar4) {
                        iVar4 = 1;
                      }
                      pbVar10 = pbVar10 + 1;
                      uVar24 = (uint)(byte)*pcVar18;
                    } while (*pcVar18 != 0);
                  }
                  *pbVar10 = 0;
                  pcStack_150 = (code *)0x10ae09;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ae09:
              pcStack_150 = (code *)0x10ae1d;
              pcVar18 = fgets(in_line,0x50,(FILE *)ifp);
              uVar12 = in_line._0_4_;
            } while( true );
          }
        }
      }
LAB_0010ae50:
      pcStack_150 = (code *)0x10ae55;
      do_questtxt_cold_5();
      outfile = (char *)pmVar15;
      goto LAB_0010ae55;
    }
  }
  pcStack_150 = do_rumors;
  pmVar15 = (msghdr *)outfile;
  do_questtxt_cold_6();
  pcStack_188 = (code *)0x10ae88;
  pcStack_180 = extraout_RAX;
  pmStack_178 = (msghdr *)outfile;
  pcStack_170 = unaff_R12;
  pcStack_168 = unaff_R13;
  pcStack_160 = infile;
  pmStack_158 = unaff_R15;
  pcStack_150 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar16 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_188 = (code *)0x10b0b8;
    do_rumors_cold_3();
LAB_0010b0b8:
    pcStack_188 = (code *)0x10b0c4;
    do_rumors_cold_2();
  }
  else {
    pcStack_188 = (code *)0x10aeab;
    pcStack_180 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_188 = (code *)0x10aeba;
    ifp = (FILE *)fopen((char *)pmVar15,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010b0b8;
    unaff_R13 = (char *)0x0;
    pcStack_188 = (code *)0x10aedc;
    fseek((FILE *)ifp,0,2);
    pcStack_188 = (code *)0x10aee8;
    lVar7 = ftell((FILE *)ifp);
    pcStack_188 = (code *)0x10af00;
    fprintf((FILE *)ofp,"%06lx\n",lVar7);
    pcStack_188 = (code *)0x10af10;
    fseek((FILE *)ifp,0,0);
    pcStack_188 = (code *)0x10af28;
    pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar11 != (char *)0x0) {
      pmVar15 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar16 = (char *)0x1;
      do {
        pbVar10 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar11 = in_line;
          pbVar10 = &xcrypt_buf;
          bVar17 = in_line[0];
          do {
            pcVar11 = (char *)((byte *)pcVar11 + 1);
            bVar20 = (byte)iVar4;
            if ((bVar17 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar10 = bVar20 ^ bVar17;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar10 = pbVar10 + 1;
            bVar17 = *pcVar11;
          } while (bVar17 != 0);
        }
        *pbVar10 = 0;
        pcStack_188 = (code *)0x10af9d;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_188 = (code *)0x10afb1;
        pcVar11 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar11 != (char *)0x0);
    }
    pcStack_188 = (code *)0x10afc2;
    fclose((FILE *)ifp);
    pcStack_188 = (code *)0x10afd1;
    ifp = (FILE *)fopen(pcVar18,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_188 = (code *)0x10aff9;
      pcVar18 = fgets(in_line,0x100,(FILE *)ifp);
      while (pcVar18 != (char *)0x0) {
        pbVar10 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar4 = 1;
          pcVar18 = in_line;
          pbVar10 = &xcrypt_buf;
          bVar17 = in_line[0];
          do {
            pcVar18 = (char *)((byte *)pcVar18 + 1);
            bVar20 = (byte)iVar4;
            if ((bVar17 & 0x60) == 0) {
              bVar20 = 0;
            }
            *pbVar10 = bVar20 ^ bVar17;
            iVar4 = iVar4 * 2;
            if (0x1f < iVar4) {
              iVar4 = 1;
            }
            pbVar10 = pbVar10 + 1;
            bVar17 = *pcVar18;
          } while (bVar17 != 0);
        }
        *pbVar10 = 0;
        pcStack_188 = (code *)0x10b071;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_188 = (code *)0x10b085;
        pcVar18 = fgets(in_line,0x100,(FILE *)ifp);
      }
      pcStack_188 = (code *)0x10b096;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_188 = do_oracles;
  pcVar11 = pcStack_180;
  __filename_00 = pcVar18;
  do_rumors_cold_1();
  pcStack_1b0 = pcVar16;
  pcStack_1a8 = unaff_R12;
  pcStack_1a0 = unaff_R13;
  pcStack_198 = pcVar18;
  pmStack_190 = pmVar15;
  pcStack_188 = (code *)unaff_RBP;
  sprintf(acStack_3b8,"%s.%s",pcVar11,"tmp");
  ifp = (FILE *)fopen(__filename_00,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b5e1:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar11,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_3b8,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar7 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
        lVar7 = 0;
        do {
          pbVar10 = (byte *)special_oracle[lVar7];
          bVar17 = *pbVar10;
          pbVar13 = &xcrypt_buf;
          if (bVar17 != 0) {
            iVar4 = 1;
            pbVar13 = &xcrypt_buf;
            do {
              pbVar10 = pbVar10 + 1;
              bVar20 = (byte)iVar4;
              if ((bVar17 & 0x60) == 0) {
                bVar20 = 0;
              }
              *pbVar13 = bVar20 ^ bVar17;
              iVar4 = iVar4 * 2;
              if (0x1f < iVar4) {
                iVar4 = 1;
              }
              pbVar13 = pbVar13 + 1;
              bVar17 = *pbVar10;
            } while (bVar17 != 0);
          }
          *pbVar13 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar3 = ofp;
        lVar7 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
        uVar12 = 1;
LAB_0010b29a:
        bVar2 = true;
LAB_0010b29d:
        while (pcVar18 = fgets(in_line,0x100,(FILE *)ifp), pcVar18 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_2b8);
            if (in_line[4] == '-' && in_line._0_4_ == 0x2d2d2d2d) goto code_r0x0010b2e9;
            pbVar10 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar4 = 1;
              pcVar18 = in_line;
              pbVar10 = &xcrypt_buf;
              bVar17 = in_line[0];
              do {
                pcVar18 = (char *)((byte *)pcVar18 + 1);
                bVar20 = (byte)iVar4;
                if ((bVar17 & 0x60) == 0) {
                  bVar20 = 0;
                }
                *pbVar10 = bVar20 ^ bVar17;
                iVar4 = iVar4 * 2;
                if (0x1f < iVar4) {
                  iVar4 = 1;
                }
                pbVar10 = pbVar10 + 1;
                bVar17 = *pcVar18;
              } while (bVar17 != 0);
            }
            *pbVar10 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar2 = false;
          }
        }
        if (!bVar2) {
          uVar12 = uVar12 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar3 = ofp;
          lVar7 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
        }
        lVar7 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_3b8);
        iVar4 = fseek((FILE *)tfp,0,0);
        if (iVar4 == 0) {
          pcVar18 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar18 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar18 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_3b8);
          sprintf(in_line,"rewind of \"%s\"",pcVar11);
          iVar4 = fseek((FILE *)ofp,0,0);
          if (iVar4 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar11);
            iVar4 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar12);
            if (-1 < iVar4) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar11);
              iVar4 = uVar12 + 1;
              while ((((lVar8 = ftell((FILE *)ofp), -1 < lVar8 &&
                       (iVar5 = fseek((FILE *)ofp,lVar8,0), -1 < iVar5)) &&
                      (iVar5 = __isoc99_fscanf(ofp,"%5lx",alStack_2b8), iVar5 == 1)) &&
                     ((iVar5 = fseek((FILE *)ofp,lVar8,0), -1 < iVar5 &&
                      (iVar5 = fprintf((FILE *)ofp,"%05lx\n",alStack_2b8[0] + lVar7), -1 < iVar5))))
                    ) {
                iVar4 = iVar4 + -1;
                if (iVar4 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b5e1;
      }
      goto LAB_0010b5f1;
    }
  }
  do_oracles_cold_3();
LAB_0010b5f1:
  pcVar18 = acStack_3b8;
  do_oracles_cold_2();
  lVar7 = (long)qt_hdr.n_hdr;
  if (0 < lVar7) {
    __s2 = qt_hdr.id;
    lVar8 = 0;
    do {
      iVar4 = strncmp(pcVar18,*__s2,3);
      if (iVar4 == 0) {
        return;
      }
      lVar8 = lVar8 + 1;
      __s2 = __s2 + 1;
    } while (lVar7 != lVar8);
  }
  return;
code_r0x0010b2e9:
  bVar1 = !bVar2;
  bVar2 = true;
  if (bVar1) goto LAB_0010b364;
  goto LAB_0010b29d;
LAB_0010b364:
  uVar12 = uVar12 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar3 = ofp;
  lVar7 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar3,"%05lx\n",lVar7);
  goto LAB_0010b29a;
}

Assistant:

void do_questtxt(const char *infile, const char *outfile)
{
	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}

	if (!(ofp = fopen(outfile, WRBMODE))) {
		perror(outfile);
		fclose(ifp);
		exit(EXIT_FAILURE);
	}

	qt_hdr.n_hdr = 0;
	qt_line = 0;
	in_msg = FALSE;

	while (fgets(in_line, 80, ifp) != 0) {
	    qt_line++;
	    if (qt_control(in_line)) do_qt_control(in_line);
	    else if (qt_comment(in_line)) continue;
	    else		    do_qt_text(in_line);
	}

	rewind(ifp);
	in_msg = FALSE;
	adjust_qt_hdrs();
	put_qt_hdrs();
	while (fgets(in_line, 80, ifp) != 0) {

		if (qt_control(in_line)) {
		    in_msg = (in_line[1] == 'C');
		    continue;
		} else if (qt_comment(in_line)) continue;
#ifdef DEBUG
		fprintf(stderr, "%ld: %s", ftell(stdout), in_line);
#endif
		fputs(xcrypt(in_line), ofp);
	}
	fclose(ifp);
	fclose(ofp);
	return;
}